

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O1

void __thiscall UEFITool::extract(UEFITool *this,UINT8 mode)

{
  int iVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  UINT8 UVar6;
  byte bVar7;
  char cVar8;
  USTATUS errorCode;
  QByteArrayView QVar9;
  QString t;
  QFile outputFile;
  QString t_2;
  QString path;
  QString name;
  QByteArray extracted;
  QModelIndex index;
  QArrayData *local_e8;
  char16_t *local_e0;
  qsizetype qStack_d8;
  QArrayData *local_d0;
  char16_t *local_c8;
  qsizetype qStack_c0;
  QString local_b8;
  QArrayData *local_a0;
  char16_t *local_98;
  qsizetype qStack_90;
  QString local_88;
  QString local_68;
  QByteArray local_48;
  QModelIndex local_30;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::currentIndex();
  if (local_30.r < 0) {
    return;
  }
  if (local_30.c < 0) {
    return;
  }
  if (local_30.m == (QAbstractItemModel *)0x0) {
    return;
  }
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char *)0x0;
  local_48.d.size = 0;
  local_68.d.size = 0;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  errorCode = FfsOperations::extract(this->ffsOps,&local_30,&local_68,&local_48,mode);
  if (errorCode == 0) {
    local_d0 = &((this->currentDir).d.d)->super_QArrayData;
    local_c8 = (this->currentDir).d.ptr;
    qStack_c0 = (this->currentDir).d.size;
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_d0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_d0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QChar)(char16_t)&local_d0);
    local_88.d.d = (Data *)local_d0;
    local_88.d.ptr = local_c8;
    local_88.d.size = qStack_c0;
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_d0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_d0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)&local_88);
    QDir::toNativeSeparators((QString *)&local_e8);
    qVar3 = local_68.d.size;
    pcVar5 = local_68.d.ptr;
    pDVar4 = local_68.d.d;
    local_68.d.d = (Data *)local_e8;
    local_e8 = &pDVar4->super_QArrayData;
    local_68.d.ptr = local_e0;
    local_68.d.size = qStack_d8;
    local_e0 = pcVar5;
    qStack_d8 = qVar3;
    if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar4->super_QArrayData,2,8);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_d0 != (QArrayData *)0x0) {
      LOCK();
      (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d0,2,8);
      }
    }
    UVar6 = TreeModel::type(this->model,&local_30);
    bVar7 = TreeModel::subtype(this->model,&local_30);
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    local_88.d.size = 0;
    if (mode == '\0') {
      switch(UVar6) {
      case '=':
        QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d3474);
        operator+(&local_b8,&local_68,".cap");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d348e);
        QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
        break;
      case '>':
        QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d34b9);
        operator+(&local_b8,&local_68,".rom");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d34d1);
        QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
        break;
      case '?':
        QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d34fa);
        operator+(&local_b8,&local_68,".rgn");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d3513);
        QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
        break;
      case '@':
        QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d353d);
        operator+(&local_b8,&local_68,".pad");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d3557);
        QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
        break;
      case 'A':
        QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d3582);
        operator+(&local_b8,&local_68,".vol");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d359b);
        QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
        break;
      case 'B':
        QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d35c5);
        operator+(&local_b8,&local_68,".ffs");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d35e0);
        QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
        break;
      case 'C':
        QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d3607);
        operator+(&local_b8,&local_68,".sct");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d3621);
        QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
        break;
      default:
        QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d364c);
        operator+(&local_b8,&local_68,".bin");
        QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d3665);
        QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
      }
LAB_0012a37c:
      qVar3 = local_88.d.size;
      pcVar5 = local_88.d.ptr;
      pDVar4 = local_88.d.d;
      local_88.d.d = (Data *)local_e8;
      local_e8 = &pDVar4->super_QArrayData;
      local_88.d.ptr = local_e0;
      local_88.d.size = qStack_d8;
      local_e0 = pcVar5;
      qStack_d8 = qVar3;
      if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar4->super_QArrayData,2,8);
        }
      }
      if (local_a0 != (QArrayData *)0x0) {
        LOCK();
        (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a0,2,8);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_d0 != (QArrayData *)0x0) {
        LOCK();
        (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        iVar1 = (local_d0->ref_)._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        local_b8.d.d = (Data *)local_d0;
joined_r0x00129d2c:
        if (iVar1 == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
        }
      }
    }
    else {
      if (mode < 3) {
        switch(UVar6) {
        case '=':
          QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d3689);
          operator+(&local_b8,&local_68,".rom");
          QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d34d1);
          QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
          break;
        default:
switchD_00129a95_caseD_3e:
          QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d37c8);
          operator+(&local_b8,&local_68,".bin");
          QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d3665);
          QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
          break;
        case 'A':
          QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d36a9);
          operator+(&local_b8,&local_68,".vbd");
          QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d36c7);
          QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
          break;
        case 'B':
          QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d36f6);
          operator+(&local_b8,&local_68,".fbd");
          QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d3716);
          QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
          break;
        case 'C':
          if (bVar7 - 0x10 < 3) {
            QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d3768);
            operator+(&local_b8,&local_68,".efi");
            QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d3796);
            QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
          }
          else {
            if (bVar7 != 0x17) goto switchD_00129a95_caseD_3e;
            QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d3747);
            operator+(&local_b8,&local_68,".vol");
            QMetaObject::tr((char *)&local_a0,(char *)&staticMetaObject,0x1d359b);
            QFileDialog::getSaveFileName(&local_e8,this,&local_d0,&local_b8,&local_a0,0,0);
          }
        }
        goto LAB_0012a37c;
      }
      QMetaObject::tr((char *)&local_b8,(char *)&staticMetaObject,0x1d364c);
      local_a0 = &(local_68.d.d)->super_QArrayData;
      local_98 = local_68.d.ptr;
      qStack_90 = local_68.d.size;
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar9.m_data = (storage_type *)0x4;
      QVar9.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar9);
      QString::append((QString *)&local_a0);
      if (local_e8 != (QArrayData *)0x0) {
        LOCK();
        (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_e8,2,8);
        }
      }
      QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1d3665);
      QFileDialog::getSaveFileName(&local_d0,this,&local_b8,&local_a0,&local_e8,0,0);
      qVar3 = local_88.d.size;
      pcVar5 = local_88.d.ptr;
      pDVar4 = local_88.d.d;
      local_88.d.d = (Data *)local_d0;
      local_d0 = &pDVar4->super_QArrayData;
      local_88.d.ptr = local_c8;
      local_88.d.size = qStack_c0;
      local_c8 = pcVar5;
      qStack_c0 = qVar3;
      if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar4->super_QArrayData,2,8);
        }
      }
      if (local_e8 != (QArrayData *)0x0) {
        LOCK();
        (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_e8,2,8);
        }
      }
      if (local_a0 != (QArrayData *)0x0) {
        LOCK();
        (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a0,2,8);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        iVar1 = ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        goto joined_r0x00129d2c;
      }
    }
    QString::trimmed_helper((QString *)&local_e8);
    qVar3 = qStack_d8;
    if (local_e8 != (QArrayData *)0x0) {
      LOCK();
      (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_e8,2,8);
      }
    }
    if (qVar3 != 0) {
      QFile::QFile((QFile *)&local_b8);
      QFile::setFileName((QString *)&local_b8);
      cVar8 = QFile::open(&local_b8,2);
      if (cVar8 == '\0') {
        QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1d3462);
        QMetaObject::tr((char *)&local_d0,(char *)&staticMetaObject,0x1d37e1);
        QMessageBox::critical(this,&local_e8,&local_d0,0x400,0);
        if (local_d0 != (QArrayData *)0x0) {
          LOCK();
          (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_d0,2,8);
          }
        }
        if (local_e8 != (QArrayData *)0x0) {
          LOCK();
          (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_e8,2,8);
          }
        }
      }
      else {
        QFile::resize((longlong)&local_b8);
        QIODevice::write((QByteArray *)&local_b8);
        QFileDevice::close();
      }
      QFile::~QFile((QFile *)&local_b8);
    }
    if (&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0012a591;
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar2 = &(local_88.d.d)->super_QArrayData;
  }
  else {
    QMetaObject::tr((char *)&local_e8,(char *)&staticMetaObject,0x1d3462);
    errorCodeToUString(&local_88,errorCode);
    QMessageBox::critical(this,&local_e8,&local_88,0x400,0);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_e8 == (QArrayData *)0x0) goto LAB_0012a591;
    LOCK();
    (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = (local_e8->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar2 = local_e8;
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(pQVar2,2,8);
  }
LAB_0012a591:
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,8);
    }
  }
  return;
}

Assistant:

void UEFITool::extract(const UINT8 mode)
{
    QModelIndex index = ui->structureTreeView->selectionModel()->currentIndex();
    if (!index.isValid())
        return;
    
    QByteArray extracted;
    QString name;
    USTATUS result = ffsOps->extract(index, name, extracted, mode);
    if (result) {
        QMessageBox::critical(this, tr("Extraction failed"), errorCodeToUString(result), QMessageBox::Ok);
        return;
    }
    
    name = QDir::toNativeSeparators(currentDir + QDir::separator() + name);
    
    //ui->statusBar->showMessage(name);
    
    UINT8 type = model->type(index);
    UINT8 subtype = model->subtype(index);
    QString path;
    if (mode == EXTRACT_MODE_AS_IS) {
        switch (type) {
            case Types::Capsule: path = QFileDialog::getSaveFileName(this, tr("Save capsule to file"), name + ".cap",  tr("Capsule files (*.cap *.bin);;All files (*)")); break;
            case Types::Image:   path = QFileDialog::getSaveFileName(this, tr("Save image to file"), name + ".rom",  tr("Image files (*.rom *.bin);;All files (*)")); break;
            case Types::Region:  path = QFileDialog::getSaveFileName(this, tr("Save region to file"), name + ".rgn",  tr("Region files (*.rgn *.bin);;All files (*)")); break;
            case Types::Padding: path = QFileDialog::getSaveFileName(this, tr("Save padding to file"), name + ".pad",  tr("Padding files (*.pad *.bin);;All files (*)")); break;
            case Types::Volume:  path = QFileDialog::getSaveFileName(this, tr("Save volume to file"), name + ".vol",  tr("Volume files (*.vol *.bin);;All files (*)")); break;
            case Types::File:    path = QFileDialog::getSaveFileName(this, tr("Save FFS file to file"), name + ".ffs",  tr("FFS files (*.ffs *.bin);;All files (*)")); break;
            case Types::Section: path = QFileDialog::getSaveFileName(this, tr("Save section to file"), name + ".sct",  tr("Section files (*.sct *.bin);;All files (*)")); break;
            default:             path = QFileDialog::getSaveFileName(this, tr("Save object to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
        }
    }
    else if (mode == EXTRACT_MODE_BODY || mode == EXTRACT_MODE_BODY_UNCOMPRESSED) {
        switch (type) {
            case Types::Capsule: path = QFileDialog::getSaveFileName(this, tr("Save capsule body to image file"), name + ".rom", tr("Image files (*.rom *.bin);;All files (*)")); break;
            case Types::Volume:  path = QFileDialog::getSaveFileName(this, tr("Save volume body to file"), name + ".vbd", tr("Volume body files (*.vbd *.bin);;All files (*)")); break;
            case Types::File:    path = QFileDialog::getSaveFileName(this, tr("Save FFS file body to file"), name + ".fbd", tr("FFS file body files (*.fbd *.bin);;All files (*)")); break;
            case Types::Section:
                if (subtype == EFI_SECTION_FIRMWARE_VOLUME_IMAGE) {
                    path = QFileDialog::getSaveFileName(this, tr("Save section body to volume file"), name + ".vol", tr("Volume files (*.vol *.bin);;All files (*)")); break;
                }
                else if (subtype == EFI_SECTION_PE32
                         || subtype == EFI_SECTION_TE
                         || subtype == EFI_SECTION_PIC) {
                    path = QFileDialog::getSaveFileName(this, tr("Save section body to EFI executable file"), name + ".efi", tr("EFI executable files (*.efi *.bin);;All files (*)")); break;
                }
            default: path = QFileDialog::getSaveFileName(this, tr("Save object body to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
        }
    }
    else path = QFileDialog::getSaveFileName(this, tr("Save object to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
    
    if (path.trimmed().isEmpty())
        return;
    
    QFile outputFile;
    outputFile.setFileName(path);
    if (!outputFile.open(QFile::WriteOnly)) {
        QMessageBox::critical(this, tr("Extraction failed"), tr("Can't open output file for rewriting"), QMessageBox::Ok);
        return;
    }
    outputFile.resize(0);
    outputFile.write(extracted);
    outputFile.close();
}